

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::moveRowsTable(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  QChar QVar5;
  int iVar6;
  long lVar7;
  QChar local_1da;
  value_type args;
  QModelIndex local_1b8;
  QChar local_19a;
  QPersistentModelIndex oneIndex;
  GenericModel testModel;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  QPersistentModelIndex twoIndex;
  QSignalSpy *spyArr [2];
  anon_class_8_1_ce415857 resetData;
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy rowsMovedSpy;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  ModelTest::ModelTest(&probe,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x2);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeMovedSpy,(QObject *)&testModel,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsAboutToBeMovedSpy.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x5e8);
  if (cVar2 == '\0') goto LAB_0011d29e;
  QSignalSpy::QSignalSpy
            (&rowsMovedSpy,(QObject *)&testModel,
             "2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsMovedSpy.sig.d.size != 0,"rowsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x5ea);
  if (cVar2 != '\0') {
    spyArr[0] = &rowsAboutToBeMovedSpy;
    spyArr[1] = &rowsMovedSpy;
    resetData.testModel = &testModel;
    moveRowsTable::anon_class_8_1_ce415857::operator()(&resetData);
    args.d.d = (Data *)0xffffffffffffffff;
    args.d.ptr = (QVariant *)0x0;
    args.d.size = 0;
    local_1b8.r = -1;
    local_1b8.c = -1;
    local_1b8.i = 0;
    local_1b8.m = (QAbstractItemModel *)0x0;
    bVar3 = GenericModel::moveRows
                      ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,(int)&local_1b8);
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                           "!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), -1)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x5f3);
    if (cVar2 != '\0') {
      lVar7 = 0;
      do {
        if (lVar7 == 0x10) {
          args.d.d = (Data *)0xffffffffffffffff;
          args.d.ptr = (QVariant *)0x0;
          args.d.size = 0;
          local_1b8.r = -1;
          local_1b8.c = -1;
          local_1b8.i = 0;
          local_1b8.m = (QAbstractItemModel *)0x0;
          bVar3 = GenericModel::moveRows
                            ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,
                             (int)&local_1b8);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 7)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x5f6);
          if (cVar2 != '\0') {
            lVar7 = 0;
            goto LAB_0011b49e;
          }
          break;
        }
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x5f5);
        lVar7 = lVar7 + 8;
      } while (cVar2 != '\0');
    }
  }
  goto LAB_0011d291;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x5f8);
    lVar7 = lVar7 + 8;
    if (cVar2 == '\0') break;
LAB_0011b49e:
    if (lVar7 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&args,-1,(QModelIndex *)0x1,(int)&local_1b8)
      ;
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveRows(QModelIndex(), -1, 1, QModelIndex(), 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x5f9);
      if (cVar2 != '\0') {
        lVar7 = 0;
        goto LAB_0011b54a;
      }
      break;
    }
  }
  goto LAB_0011d291;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x5fb);
    lVar7 = lVar7 + 8;
    if (cVar2 == '\0') break;
LAB_0011b54a:
    if (lVar7 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&args,6,(QModelIndex *)0x1,(int)&local_1b8);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveRows(QModelIndex(), 6, 1, QModelIndex(), 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x5fc);
      if (cVar2 != '\0') {
        lVar7 = 0;
        goto LAB_0011b5f6;
      }
      break;
    }
  }
  goto LAB_0011d291;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x5fe);
    lVar7 = lVar7 + 8;
    if (cVar2 == '\0') break;
LAB_0011b5f6:
    if (lVar7 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&args,1,(QModelIndex *)0x2,(int)&local_1b8);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 2)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x5ff);
      if (cVar2 != '\0') {
        lVar7 = 0;
        goto LAB_0011b6a1;
      }
      break;
    }
  }
  goto LAB_0011d291;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x601);
    lVar7 = lVar7 + 8;
    if (cVar2 == '\0') break;
LAB_0011b6a1:
    if (lVar7 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&args,1,(QModelIndex *)0x2,(int)&local_1b8);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x602);
      if (cVar2 != '\0') {
        lVar7 = 0;
        goto LAB_0011b74d;
      }
      break;
    }
  }
  goto LAB_0011d291;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x604);
    lVar7 = lVar7 + 8;
    if (cVar2 == '\0') break;
LAB_0011b74d:
    if (lVar7 == 0x10) {
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x2);
      QPersistentModelIndex::QPersistentModelIndex(&twoIndex,(QModelIndex *)&args);
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,
                               (int)&local_1b8);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 4)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x607);
      if (cVar2 == '\0') goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,0,"testModel.index(0, 0).data().toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x608);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,1,"testModel.index(1, 0).data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x609);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,3,"testModel.index(2, 0).data().toInt()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x60a);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,2,"testModel.index(3, 0).data().toInt()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x60b);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,4,"testModel.index(4, 0).data().toInt()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x60c);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,5,"testModel.index(5, 0).data().toInt()","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x60d);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1da.ucs = L'a';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1da,"testModel.index(0, 1).data().value<QChar>()"
                         ,"QChar(QLatin1Char(\'a\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x60e);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1da.ucs = L'b';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1da,"testModel.index(1, 1).data().value<QChar>()"
                         ,"QChar(QLatin1Char(\'b\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x60f);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1da.ucs = L'd';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1da,"testModel.index(2, 1).data().value<QChar>()"
                         ,"QChar(QLatin1Char(\'d\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x610);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1da.ucs = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1da,"testModel.index(3, 1).data().value<QChar>()"
                         ,"QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x611);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1da.ucs = L'e';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1da,"testModel.index(4, 1).data().value<QChar>()"
                         ,"QChar(QLatin1Char(\'e\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x612);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011d284;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1da.ucs = L'f';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1da,"testModel.index(5, 1).data().value<QChar>()"
                         ,"QChar(QLatin1Char(\'f\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x613);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011d284;
      QPersistentModelIndex::data((int)&args);
      QVar5 = qvariant_cast<QChar>((QVariant *)&args);
      local_1b8.r._0_2_ = QVar5.ucs;
      local_178 = CONCAT62(local_178._2_6_,99);
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&local_1b8,(QChar *)&local_178,"twoIndex.data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x614);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011d284;
      iVar6 = QPersistentModelIndex::row();
      cVar2 = QTest::qCompare(iVar6,3,"twoIndex.row()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x615);
      if (cVar2 == '\0') goto LAB_0011d284;
      lVar7 = 0;
      goto LAB_0011bed8;
    }
  }
  goto LAB_0011d291;
  while( true ) {
    lVar1 = *(long *)((long)spyArr + lVar7);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x617);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_1b8,args.d.ptr);
    bVar4 = true;
    if ((-1 < local_1b8.r) && (-1 < (long)local_1b8._0_8_)) {
      bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(0).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x619);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x61a);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x61b);
    if (cVar2 == '\0') goto LAB_0011d27a;
    qvariant_cast<QModelIndex>(&local_1b8,args.d.ptr + 3);
    bVar4 = true;
    if ((-1 < local_1b8.r) && (-1 < (long)local_1b8._0_8_)) {
      bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(3).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x61c);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar6,4,"args.at(4).toInt()","4",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x61d);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar7 = lVar7 + 8;
    if (cVar2 == '\0') break;
LAB_0011bed8:
    if (lVar7 == 0x10) {
      moveRowsTable::anon_class_8_1_ce415857::operator()(&resetData);
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x2);
      QPersistentModelIndex::operator=(&twoIndex,(QModelIndex *)&args);
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,
                               (int)&local_1b8);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x622);
      if (cVar2 != '\0') {
        local_178 = 0xffffffffffffffff;
        local_170 = 0;
        uStack_168 = 0;
        GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&args,&local_1b8,0);
        iVar6 = QVariant::toInt((bool *)&args);
        cVar2 = QTest::qCompare(iVar6,2,"testModel.index(0, 0).data().toInt()","2",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x623);
        QVariant::~QVariant((QVariant *)&args);
        if (cVar2 != '\0') {
          local_178 = 0xffffffffffffffff;
          local_170 = 0;
          uStack_168 = 0;
          GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
          QModelIndex::data((QVariant *)&args,&local_1b8,0);
          iVar6 = QVariant::toInt((bool *)&args);
          cVar2 = QTest::qCompare(iVar6,0,"testModel.index(1, 0).data().toInt()","0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x624);
          QVariant::~QVariant((QVariant *)&args);
          if (cVar2 != '\0') {
            local_178 = 0xffffffffffffffff;
            local_170 = 0;
            uStack_168 = 0;
            GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x2);
            QModelIndex::data((QVariant *)&args,&local_1b8,0);
            iVar6 = QVariant::toInt((bool *)&args);
            cVar2 = QTest::qCompare(iVar6,1,"testModel.index(2, 0).data().toInt()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x625);
            QVariant::~QVariant((QVariant *)&args);
            if (cVar2 != '\0') {
              local_178 = 0xffffffffffffffff;
              local_170 = 0;
              uStack_168 = 0;
              GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x3);
              QModelIndex::data((QVariant *)&args,&local_1b8,0);
              iVar6 = QVariant::toInt((bool *)&args);
              cVar2 = QTest::qCompare(iVar6,3,"testModel.index(3, 0).data().toInt()","3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x626);
              QVariant::~QVariant((QVariant *)&args);
              if (cVar2 != '\0') {
                local_178 = 0xffffffffffffffff;
                local_170 = 0;
                uStack_168 = 0;
                GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x4);
                QModelIndex::data((QVariant *)&args,&local_1b8,0);
                iVar6 = QVariant::toInt((bool *)&args);
                cVar2 = QTest::qCompare(iVar6,4,"testModel.index(4, 0).data().toInt()","4",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x627);
                QVariant::~QVariant((QVariant *)&args);
                if (cVar2 != '\0') {
                  local_178 = 0xffffffffffffffff;
                  local_170 = 0;
                  uStack_168 = 0;
                  GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x5);
                  QModelIndex::data((QVariant *)&args,&local_1b8,0);
                  iVar6 = QVariant::toInt((bool *)&args);
                  cVar2 = QTest::qCompare(iVar6,5,"testModel.index(5, 0).data().toInt()","5",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x628);
                  QVariant::~QVariant((QVariant *)&args);
                  if (cVar2 != '\0') {
                    local_178 = 0xffffffffffffffff;
                    local_170 = 0;
                    uStack_168 = 0;
                    GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
                    QModelIndex::data((QVariant *)&args,&local_1b8,0);
                    _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                    local_1da.ucs = L'c';
                    bVar4 = QTest::qCompare<QChar,QChar>
                                      ((QChar *)&oneIndex,&local_1da,
                                       "testModel.index(0, 1).data().value<QChar>()",
                                       "QChar(QLatin1Char(\'c\'))",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x629);
                    QVariant::~QVariant((QVariant *)&args);
                    if (bVar4) {
                      local_178 = 0xffffffffffffffff;
                      local_170 = 0;
                      uStack_168 = 0;
                      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                      QModelIndex::data((QVariant *)&args,&local_1b8,0);
                      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                      local_1da.ucs = L'a';
                      bVar4 = QTest::qCompare<QChar,QChar>
                                        ((QChar *)&oneIndex,&local_1da,
                                         "testModel.index(1, 1).data().value<QChar>()",
                                         "QChar(QLatin1Char(\'a\'))",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x62a);
                      QVariant::~QVariant((QVariant *)&args);
                      if (bVar4) {
                        local_178 = 0xffffffffffffffff;
                        local_170 = 0;
                        uStack_168 = 0;
                        GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x2);
                        QModelIndex::data((QVariant *)&args,&local_1b8,0);
                        _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                        local_1da.ucs = L'b';
                        bVar4 = QTest::qCompare<QChar,QChar>
                                          ((QChar *)&oneIndex,&local_1da,
                                           "testModel.index(2, 1).data().value<QChar>()",
                                           "QChar(QLatin1Char(\'b\'))",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x62b);
                        QVariant::~QVariant((QVariant *)&args);
                        if (bVar4) {
                          local_178 = 0xffffffffffffffff;
                          local_170 = 0;
                          uStack_168 = 0;
                          GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x3);
                          QModelIndex::data((QVariant *)&args,&local_1b8,0);
                          _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                          local_1da.ucs = L'd';
                          bVar4 = QTest::qCompare<QChar,QChar>
                                            ((QChar *)&oneIndex,&local_1da,
                                             "testModel.index(3, 1).data().value<QChar>()",
                                             "QChar(QLatin1Char(\'d\'))",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x62c);
                          QVariant::~QVariant((QVariant *)&args);
                          if (bVar4) {
                            local_178 = 0xffffffffffffffff;
                            local_170 = 0;
                            uStack_168 = 0;
                            GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x4);
                            QModelIndex::data((QVariant *)&args,&local_1b8,0);
                            _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                            local_1da.ucs = L'e';
                            bVar4 = QTest::qCompare<QChar,QChar>
                                              ((QChar *)&oneIndex,&local_1da,
                                               "testModel.index(4, 1).data().value<QChar>()",
                                               "QChar(QLatin1Char(\'e\'))",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x62d);
                            QVariant::~QVariant((QVariant *)&args);
                            if (bVar4) {
                              local_178 = 0xffffffffffffffff;
                              local_170 = 0;
                              uStack_168 = 0;
                              GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x5
                                                 );
                              QModelIndex::data((QVariant *)&args,&local_1b8,0);
                              _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                              local_1da.ucs = L'f';
                              bVar4 = QTest::qCompare<QChar,QChar>
                                                ((QChar *)&oneIndex,&local_1da,
                                                 "testModel.index(5, 1).data().value<QChar>()",
                                                 "QChar(QLatin1Char(\'f\'))",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x62e);
                              QVariant::~QVariant((QVariant *)&args);
                              if (bVar4) {
                                QPersistentModelIndex::data((int)&args);
                                QVar5 = qvariant_cast<QChar>((QVariant *)&args);
                                local_1b8.r._0_2_ = QVar5.ucs;
                                local_178 = CONCAT62(local_178._2_6_,99);
                                bVar4 = QTest::qCompare<QChar,QChar>
                                                  ((QChar *)&local_1b8,(QChar *)&local_178,
                                                   "twoIndex.data().value<QChar>()",
                                                   "QChar(QLatin1Char(\'c\'))",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62f);
                                QVariant::~QVariant((QVariant *)&args);
                                if (bVar4) {
                                  iVar6 = QPersistentModelIndex::row();
                                  cVar2 = QTest::qCompare(iVar6,0,"twoIndex.row()","0",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x630);
                                  if (cVar2 != '\0') {
                                    lVar7 = 0;
                                    goto LAB_0011c7db;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0011d284;
  while( true ) {
    lVar1 = *(long *)((long)spyArr + lVar7);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x632);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_1b8,args.d.ptr);
    bVar4 = true;
    if ((-1 < local_1b8.r) && (-1 < (long)local_1b8._0_8_)) {
      bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(0).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x634);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x635);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x636);
    if (cVar2 == '\0') goto LAB_0011d27a;
    qvariant_cast<QModelIndex>(&local_1b8,args.d.ptr + 3);
    bVar4 = true;
    if ((-1 < local_1b8.r) && (-1 < (long)local_1b8._0_8_)) {
      bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(3).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x637);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar6,0,"args.at(4).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x638);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar7 = lVar7 + 8;
    if (cVar2 == '\0') break;
LAB_0011c7db:
    if (lVar7 == 0x10) {
      moveRowsTable::anon_class_8_1_ce415857::operator()(&resetData);
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x2);
      QPersistentModelIndex::operator=(&twoIndex,(QModelIndex *)&args);
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&args,2,(QModelIndex *)0x1,
                               (int)&local_1b8);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 6)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x63d);
      if (cVar2 != '\0') {
        local_178 = 0xffffffffffffffff;
        local_170 = 0;
        uStack_168 = 0;
        GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&args,&local_1b8,0);
        iVar6 = QVariant::toInt((bool *)&args);
        cVar2 = QTest::qCompare(iVar6,0,"testModel.index(0, 0).data().toInt()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x63e);
        QVariant::~QVariant((QVariant *)&args);
        if (cVar2 != '\0') {
          local_178 = 0xffffffffffffffff;
          local_170 = 0;
          uStack_168 = 0;
          GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
          QModelIndex::data((QVariant *)&args,&local_1b8,0);
          iVar6 = QVariant::toInt((bool *)&args);
          cVar2 = QTest::qCompare(iVar6,1,"testModel.index(1, 0).data().toInt()","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x63f);
          QVariant::~QVariant((QVariant *)&args);
          if (cVar2 != '\0') {
            local_178 = 0xffffffffffffffff;
            local_170 = 0;
            uStack_168 = 0;
            GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x2);
            QModelIndex::data((QVariant *)&args,&local_1b8,0);
            iVar6 = QVariant::toInt((bool *)&args);
            cVar2 = QTest::qCompare(iVar6,3,"testModel.index(2, 0).data().toInt()","3",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x640);
            QVariant::~QVariant((QVariant *)&args);
            if (cVar2 != '\0') {
              local_178 = 0xffffffffffffffff;
              local_170 = 0;
              uStack_168 = 0;
              GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x3);
              QModelIndex::data((QVariant *)&args,&local_1b8,0);
              iVar6 = QVariant::toInt((bool *)&args);
              cVar2 = QTest::qCompare(iVar6,4,"testModel.index(3, 0).data().toInt()","4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x641);
              QVariant::~QVariant((QVariant *)&args);
              if (cVar2 != '\0') {
                local_178 = 0xffffffffffffffff;
                local_170 = 0;
                uStack_168 = 0;
                GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x4);
                QModelIndex::data((QVariant *)&args,&local_1b8,0);
                iVar6 = QVariant::toInt((bool *)&args);
                cVar2 = QTest::qCompare(iVar6,5,"testModel.index(4, 0).data().toInt()","5",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x642);
                QVariant::~QVariant((QVariant *)&args);
                if (cVar2 != '\0') {
                  local_178 = 0xffffffffffffffff;
                  local_170 = 0;
                  uStack_168 = 0;
                  GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x5);
                  QModelIndex::data((QVariant *)&args,&local_1b8,0);
                  iVar6 = QVariant::toInt((bool *)&args);
                  cVar2 = QTest::qCompare(iVar6,2,"testModel.index(5, 0).data().toInt()","2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x643);
                  QVariant::~QVariant((QVariant *)&args);
                  if (cVar2 != '\0') {
                    local_178 = 0xffffffffffffffff;
                    local_170 = 0;
                    uStack_168 = 0;
                    GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
                    QModelIndex::data((QVariant *)&args,&local_1b8,0);
                    _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                    local_1da.ucs = L'a';
                    bVar4 = QTest::qCompare<QChar,QChar>
                                      ((QChar *)&oneIndex,&local_1da,
                                       "testModel.index(0, 1).data().value<QChar>()",
                                       "QChar(QLatin1Char(\'a\'))",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x644);
                    QVariant::~QVariant((QVariant *)&args);
                    if (bVar4) {
                      local_178 = 0xffffffffffffffff;
                      local_170 = 0;
                      uStack_168 = 0;
                      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
                      QModelIndex::data((QVariant *)&args,&local_1b8,0);
                      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                      local_1da.ucs = L'b';
                      bVar4 = QTest::qCompare<QChar,QChar>
                                        ((QChar *)&oneIndex,&local_1da,
                                         "testModel.index(1, 1).data().value<QChar>()",
                                         "QChar(QLatin1Char(\'b\'))",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x645);
                      QVariant::~QVariant((QVariant *)&args);
                      if (bVar4) {
                        local_178 = 0xffffffffffffffff;
                        local_170 = 0;
                        uStack_168 = 0;
                        GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x2);
                        QModelIndex::data((QVariant *)&args,&local_1b8,0);
                        _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                        local_1da.ucs = L'd';
                        bVar4 = QTest::qCompare<QChar,QChar>
                                          ((QChar *)&oneIndex,&local_1da,
                                           "testModel.index(2, 1).data().value<QChar>()",
                                           "QChar(QLatin1Char(\'d\'))",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x646);
                        QVariant::~QVariant((QVariant *)&args);
                        if (bVar4) {
                          local_178 = 0xffffffffffffffff;
                          local_170 = 0;
                          uStack_168 = 0;
                          GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x3);
                          QModelIndex::data((QVariant *)&args,&local_1b8,0);
                          _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                          local_1da.ucs = L'e';
                          bVar4 = QTest::qCompare<QChar,QChar>
                                            ((QChar *)&oneIndex,&local_1da,
                                             "testModel.index(3, 1).data().value<QChar>()",
                                             "QChar(QLatin1Char(\'e\'))",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x647);
                          QVariant::~QVariant((QVariant *)&args);
                          if (bVar4) {
                            local_178 = 0xffffffffffffffff;
                            local_170 = 0;
                            uStack_168 = 0;
                            GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x4);
                            QModelIndex::data((QVariant *)&args,&local_1b8,0);
                            _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                            local_1da.ucs = L'f';
                            bVar4 = QTest::qCompare<QChar,QChar>
                                              ((QChar *)&oneIndex,&local_1da,
                                               "testModel.index(4, 1).data().value<QChar>()",
                                               "QChar(QLatin1Char(\'f\'))",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x648);
                            QVariant::~QVariant((QVariant *)&args);
                            if (bVar4) {
                              local_178 = 0xffffffffffffffff;
                              local_170 = 0;
                              uStack_168 = 0;
                              GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x5
                                                 );
                              QModelIndex::data((QVariant *)&args,&local_1b8,0);
                              _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                              local_1da.ucs = L'c';
                              bVar4 = QTest::qCompare<QChar,QChar>
                                                ((QChar *)&oneIndex,&local_1da,
                                                 "testModel.index(5, 1).data().value<QChar>()",
                                                 "QChar(QLatin1Char(\'c\'))",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x649);
                              QVariant::~QVariant((QVariant *)&args);
                              if (bVar4) {
                                QPersistentModelIndex::data((int)&args);
                                QVar5 = qvariant_cast<QChar>((QVariant *)&args);
                                local_1b8.r._0_2_ = QVar5.ucs;
                                local_178 = CONCAT62(local_178._2_6_,99);
                                bVar4 = QTest::qCompare<QChar,QChar>
                                                  ((QChar *)&local_1b8,(QChar *)&local_178,
                                                   "twoIndex.data().value<QChar>()",
                                                   "QChar(QLatin1Char(\'c\'))",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64a);
                                QVariant::~QVariant((QVariant *)&args);
                                if (bVar4) {
                                  iVar6 = QPersistentModelIndex::row();
                                  cVar2 = QTest::qCompare(iVar6,5,"twoIndex.row()","5",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64b);
                                  if (cVar2 != '\0') {
                                    lVar7 = 0;
                                    goto LAB_0011d0df;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0011d284;
  while( true ) {
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_1b8,args.d.ptr);
    bVar4 = true;
    if ((-1 < local_1b8.r) && (-1 < (long)local_1b8._0_8_)) {
      bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(0).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x64f);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x650);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar6,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x651);
    if (cVar2 == '\0') goto LAB_0011d27a;
    qvariant_cast<QModelIndex>(&local_1b8,args.d.ptr + 3);
    bVar4 = true;
    if ((-1 < local_1b8.r) && (-1 < (long)local_1b8._0_8_)) {
      bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(3).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x652);
    if (cVar2 == '\0') goto LAB_0011d27a;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar6,6,"args.at(4).toInt()","6",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x653);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar7 = lVar7 + 8;
    if (cVar2 == '\0') break;
LAB_0011d0df:
    if (lVar7 == 0x10) {
      moveRowsTable::anon_class_8_1_ce415857::operator()(&resetData);
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex(&oneIndex,(QModelIndex *)&args);
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&args,0,(QModelIndex *)0x2,
                               (int)&local_1b8);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(QModelIndex(), 0, 2, QModelIndex(), 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x658);
      if (cVar2 == '\0') goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,2,"testModel.index(0, 0).data().toInt()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x659);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,0,"testModel.index(1, 0).data().toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x65a);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,1,"testModel.index(2, 0).data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x65b);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,3,"testModel.index(3, 0).data().toInt()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x65c);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,4,"testModel.index(4, 0).data().toInt()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x65d);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      iVar6 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar6,5,"testModel.index(5, 0).data().toInt()","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x65e);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      local_1da = qvariant_cast<QChar>((QVariant *)&args);
      local_19a.ucs = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1da,&local_19a,"testModel.index(0, 1).data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x65f);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      local_1da = qvariant_cast<QChar>((QVariant *)&args);
      local_19a.ucs = L'a';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1da,&local_19a,"testModel.index(1, 1).data().value<QChar>()",
                         "QChar(QLatin1Char(\'a\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x660);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      local_1da = qvariant_cast<QChar>((QVariant *)&args);
      local_19a.ucs = L'b';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1da,&local_19a,"testModel.index(2, 1).data().value<QChar>()",
                         "QChar(QLatin1Char(\'b\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x661);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      local_1da = qvariant_cast<QChar>((QVariant *)&args);
      local_19a.ucs = L'd';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1da,&local_19a,"testModel.index(3, 1).data().value<QChar>()",
                         "QChar(QLatin1Char(\'d\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x662);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      local_1da = qvariant_cast<QChar>((QVariant *)&args);
      local_19a.ucs = L'e';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1da,&local_19a,"testModel.index(4, 1).data().value<QChar>()",
                         "QChar(QLatin1Char(\'e\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x663);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011dbce;
      local_178 = 0xffffffffffffffff;
      local_170 = 0;
      uStack_168 = 0;
      GenericModel::index((int)&local_1b8,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,&local_1b8,0);
      local_1da = qvariant_cast<QChar>((QVariant *)&args);
      local_19a.ucs = L'f';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1da,&local_19a,"testModel.index(5, 1).data().value<QChar>()",
                         "QChar(QLatin1Char(\'f\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x664);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011dbce;
      QPersistentModelIndex::data((int)&args);
      QVar5 = qvariant_cast<QChar>((QVariant *)&args);
      local_1b8.r._0_2_ = QVar5.ucs;
      local_178 = CONCAT62(local_178._2_6_,0x62);
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&local_1b8,(QChar *)&local_178,"oneIndex.data().value<QChar>()",
                         "QChar(QLatin1Char(\'b\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x665);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011dbce;
      iVar6 = QPersistentModelIndex::row();
      cVar2 = QTest::qCompare(iVar6,2,"oneIndex.row()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x666);
      if (cVar2 == '\0') goto LAB_0011dbce;
      lVar7 = 0;
      goto LAB_0011da2c;
    }
    lVar1 = *(long *)((long)spyArr + lVar7);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x64d);
    if (cVar2 == '\0') break;
  }
  goto LAB_0011d284;
LAB_0011d27a:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  goto LAB_0011d284;
LAB_0011da2c:
  do {
    if (lVar7 == 0x10) break;
    lVar1 = *(long *)((long)spyArr + lVar7);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x668);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst
              ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_1b8,args.d.ptr);
    bVar4 = true;
    if ((-1 < local_1b8.r) && (-1 < (long)local_1b8._0_8_)) {
      bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(0).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x66a);
    if (cVar2 == '\0') {
LAB_0011dbc4:
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
      break;
    }
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x66b);
    if (cVar2 == '\0') goto LAB_0011dbc4;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar6,1,"args.at(2).toInt()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x66c);
    if (cVar2 == '\0') goto LAB_0011dbc4;
    qvariant_cast<QModelIndex>(&local_1b8,args.d.ptr + 3);
    bVar4 = true;
    if ((-1 < local_1b8.r) && (-1 < (long)local_1b8._0_8_)) {
      bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
    }
    cVar2 = QTest::qVerify(bVar4,"!args.at(3).value<QModelIndex>().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x66d);
    if (cVar2 == '\0') goto LAB_0011dbc4;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar6,3,"args.at(4).toInt()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x66e);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar7 = lVar7 + 8;
  } while (cVar2 != '\0');
LAB_0011dbce:
  QPersistentModelIndex::~QPersistentModelIndex(&oneIndex);
LAB_0011d284:
  QPersistentModelIndex::~QPersistentModelIndex(&twoIndex);
LAB_0011d291:
  QSignalSpy::~QSignalSpy(&rowsMovedSpy);
LAB_0011d29e:
  QSignalSpy::~QSignalSpy(&rowsAboutToBeMovedSpy);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveRowsTable()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 6);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    const auto resetData = [&testModel]() {
        for (int i = 0; i < 6; ++i) {
            testModel.setData(testModel.index(i, 0), i);
            testModel.setData(testModel.index(i, 1), QChar('a' + i));
        }
    };
    resetData();
    QVERIFY(!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), -1, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 6, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 4));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 4);
    }

    resetData();
    twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 0));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 0);
    }

    resetData();
    twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 6));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 6);
    }

    resetData();
    QPersistentModelIndex oneIndex = testModel.index(1, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 0, 2, QModelIndex(), 3));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(oneIndex.data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(oneIndex.row(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 3);
    }
}